

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void SyBigEndianPack64(uchar *buf,sxu64 n64)

{
  sxu64 n64_local;
  uchar *buf_local;
  
  buf[7] = (uchar)n64;
  buf[6] = (uchar)(n64 >> 8);
  buf[5] = (uchar)(n64 >> 0x10);
  buf[4] = (uchar)(n64 >> 0x18);
  buf[3] = (uchar)(n64 >> 0x20);
  buf[2] = (uchar)(n64 >> 0x28);
  buf[1] = (uchar)(n64 >> 0x30);
  *buf = (uchar)(n64 >> 0x38);
  return;
}

Assistant:

JX9_PRIVATE void SyBigEndianPack64(unsigned char *buf,sxu64 n64)
{
	buf[7] = n64 & 0xFF; n64 >>=8;
	buf[6] = n64 & 0xFF; n64 >>=8;
	buf[5] = n64 & 0xFF; n64 >>=8;
	buf[4] = n64 & 0xFF; n64 >>=8;
	buf[3] = n64 & 0xFF; n64 >>=8;
	buf[2] = n64 & 0xFF; n64 >>=8;
	buf[1] = n64 & 0xFF; n64 >>=8;
	buf[0] = (sxu8)n64 ; 
}